

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# discontinuous_fe_constant.h
# Opt level: O3

Matrix<double,__1,__1,_0,__1,__1> * __thiscall
projects::dpg::FeDiscontinuousO0Segment<double>::EvalReferenceShapeFunctions
          (Matrix<double,__1,__1,_0,__1,__1> *__return_storage_ptr__,
          FeDiscontinuousO0Segment<double> *this,MatrixXd *refcoords)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long lVar3;
  undefined1 auVar4 [16];
  ulong uVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  stringstream ss;
  string local_210;
  string local_1f0;
  string local_1d0;
  size_type local_1b0;
  undefined1 local_1a8 [16];
  variable_if_dynamic<long,__1> local_198;
  XprTypeNested local_190;
  
  if ((refcoords->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows
      == 1) {
    uVar5 = (ulong)(uint)(refcoords->
                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
                         .m_cols;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
    m_storage.m_data = (double *)0x0;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
    m_storage.m_rows = 0;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
    m_storage.m_cols = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
              (&__return_storage_ptr__->
                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,1,uVar5);
    local_1a8._0_8_ = &DAT_3ff0000000000000;
    Eigen::
    CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>
    ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                      *)&local_210,1,uVar5,(scalar_constant_op<double> *)local_1a8);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_1a8,
               __return_storage_ptr__,0);
    local_1b0 = local_210.field_2._M_allocated_capacity;
    Eigen::internal::
    resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,_1,1,1,_1>>,double,double>
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_1a8,
               (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                *)&local_210,(assign_op<double,_double> *)&local_1f0);
    auVar4 = _DAT_00346050;
    if (0 < local_198.m_value) {
      lVar3 = (local_190->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
              m_storage.m_rows;
      uVar5 = local_198.m_value + 1U & 0xfffffffffffffffe;
      lVar6 = local_198.m_value + -1;
      auVar7._8_4_ = (int)lVar6;
      auVar7._0_8_ = lVar6;
      auVar7._12_4_ = (int)((ulong)lVar6 >> 0x20);
      auVar7 = auVar7 ^ _DAT_00346050;
      auVar8 = _DAT_00346040;
      do {
        auVar9 = auVar8 ^ auVar4;
        if ((bool)(~(auVar9._4_4_ == auVar7._4_4_ && auVar7._0_4_ < auVar9._0_4_ ||
                    auVar7._4_4_ < auVar9._4_4_) & 1)) {
          *(size_type *)local_1a8._0_8_ = local_1b0;
        }
        if ((auVar9._12_4_ != auVar7._12_4_ || auVar9._8_4_ <= auVar7._8_4_) &&
            auVar9._12_4_ <= auVar7._12_4_) {
          *(size_type *)(local_1a8._0_8_ + lVar3 * 8) = local_1b0;
        }
        lVar6 = auVar8._8_8_;
        auVar8._0_8_ = auVar8._0_8_ + 2;
        auVar8._8_8_ = lVar6 + 2;
        local_1a8._0_8_ = local_1a8._0_8_ + lVar3 * 2 * 8;
        uVar5 = uVar5 - 2;
      } while (uVar5 != 0);
    }
    return __return_storage_ptr__;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_198,"Reference coordinates must be 1-vectors",0x27);
  paVar1 = &local_210.field_2;
  local_210._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"refcoords.rows() == 1","");
  paVar2 = &local_1f0.field_2;
  local_1f0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f0,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../discontinuous_fe_constant.h"
             ,"");
  std::__cxx11::stringbuf::str();
  lf::base::AssertionFailed(&local_210,&local_1f0,0x100,&local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != paVar1) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  local_210._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"false","");
  local_1f0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f0,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/dpg/convergence_studies/../discontinuous_fe_constant.h"
             ,"");
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"");
  lf::base::AssertionFailed(&local_210,&local_1f0,0x100,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  abort();
}

Assistant:

[[nodiscard]] Eigen::Matrix<SCALAR, Eigen::Dynamic, Eigen::Dynamic>
  EvalReferenceShapeFunctions(const Eigen::MatrixXd& refcoords) const override {
    LF_ASSERT_MSG(refcoords.rows() == 1,
                  "Reference coordinates must be 1-vectors");
    const size_type n_pts(refcoords.cols());
    Eigen::Matrix<SCALAR, Eigen::Dynamic, Eigen::Dynamic> result(1, n_pts);
    result.row(0) = Eigen::RowVectorXd::Constant(n_pts, 1);
    return result;
  }